

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

void __thiscall
QUtil::file_provider(std::__cxx11::string_const&)::$_0::__0
          (__0 *this,anon_class_32_1_bc207785 *param_1)

{
  anon_class_32_1_bc207785 *param_1_local;
  anon_class_32_1_bc207785 *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  return;
}

Assistant:

std::string
QUtil::path_basename(std::string const& filename)
{
#ifdef _WIN32
    char const* pathsep = "/\\";
#else
    char const* pathsep = "/";
#endif
    std::string last = filename;
    auto len = last.length();
    while (len > 1) {
        auto pos = last.find_last_of(pathsep);
        if (pos == len - 1) {
            last.pop_back();
            --len;
        } else if (pos == std::string::npos) {
            break;
        } else {
            last = last.substr(pos + 1);
            break;
        }
    }
    return last;
}